

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int jmp_list_merge(Parser *psr,int left,int right)

{
  int jmp_idx;
  int iVar1;
  int iVar2;
  
  iVar2 = left;
  if ((right != -1) && (iVar2 = right, iVar1 = right, left != -1)) {
    do {
      jmp_idx = iVar1;
      iVar1 = jmp_follow(psr,jmp_idx);
    } while (iVar1 != -1);
    jmp_set_target(psr,jmp_idx,left);
  }
  return iVar2;
}

Assistant:

static int jmp_list_merge(Parser *psr, int left, int right) {
	// If either jump list is empty, the result is trivial
	if (right == -1) {
		return left;
	} else if (left == -1) {
		return right;
	}

	// Find the last element in `right`
	int last = right;
	while (jmp_follow(psr, last) != -1) {
		last = jmp_follow(psr, last);
	}

	// Point the last element in `right` to `left`
	jmp_set_target(psr, last, left);

	// The head of the merged list must be `right`
	return right;
}